

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testInit
          (VaryingStructureMemberLocationTest *this)

{
  pointer *pptVar1;
  iterator iVar2;
  testCase tVar3;
  testCase tVar4;
  GLuint stage;
  STAGES SVar5;
  testCase test_case_out;
  testCase test_case_in;
  testCase local_38;
  testCase local_30;
  
  SVar5 = COMPUTE;
  do {
    if (SVar5 != COMPUTE) {
      local_30.m_is_input = true;
      local_38._0_4_ = local_38._0_4_ & 0xffffff00;
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_38.m_stage = SVar5;
      local_30.m_stage = SVar5;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>>
        ::
        _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase_const&>
                  ((vector<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>>
                    *)&this->m_test_cases,iVar2,&local_30);
      }
      else {
        tVar4.m_stage = SVar5;
        tVar4.m_is_input = true;
        tVar4._1_3_ = local_30._1_3_;
        *iVar2._M_current = tVar4;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      if (SVar5 != FRAGMENT) {
        iVar2._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>>
          ::
          _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase_const&>
                    ((vector<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>>
                      *)&this->m_test_cases,iVar2,&local_38);
        }
        else {
          tVar3.m_stage = local_38.m_stage;
          tVar3.m_is_input = local_38.m_is_input;
          tVar3._1_3_ = local_38._1_3_;
          *iVar2._M_current = tVar3;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
      }
    }
    SVar5 = SVar5 + VERTEX;
  } while (SVar5 != STAGE_MAX);
  return;
}

Assistant:

void VaryingStructureMemberLocationTest::testInit()
{
	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		if (Utils::Shader::COMPUTE == stage)
		{
			continue;
		}

		testCase test_case_in  = { true, (Utils::Shader::STAGES)stage };
		testCase test_case_out = { false, (Utils::Shader::STAGES)stage };

		m_test_cases.push_back(test_case_in);

		if (Utils::Shader::FRAGMENT != stage)
		{
			m_test_cases.push_back(test_case_out);
		}
	}
}